

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

SockaddrAny __thiscall
perfetto::base::anon_unknown_0::MakeSockAddr
          (anon_unknown_0 *this,SockFamily family,string *socket_name)

{
  uint uVar1;
  ulong __n;
  code *pcVar2;
  pointer text;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  uint *puVar6;
  char *pcVar7;
  char cVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  SockaddrAny SVar10;
  addrinfo *addr_info_1;
  addrinfo *addr_info;
  pointer local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port;
  sockaddr_un saddr;
  
  if (family == kInet6) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&saddr,"]",(allocator<char> *)&addr_info);
    SplitString(&parts,socket_name,(string *)&saddr);
    ::std::__cxx11::string::~string((string *)&saddr);
    text = parts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if ((long)parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      pcVar5 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar6 = (uint *)__errno_location();
      uVar1 = *puVar6;
      pcVar7 = strerror(uVar1);
      LogMessage(kLogError,pcVar5,0x106ef,"%s (errno: %d, %s)","PERFETTO_CHECK(parts.size() == 2)",
                 (ulong)uVar1,pcVar7);
LAB_0031c577:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&saddr,"[",(allocator<char> *)&port);
    SplitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&addr_info,text,(string *)&saddr);
    ::std::__cxx11::string::~string((string *)&saddr);
    if ((long)local_d8 - (long)addr_info != 0x20) {
      pcVar5 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar6 = (uint *)__errno_location();
      uVar1 = *puVar6;
      pcVar7 = strerror(uVar1);
      LogMessage(kLogError,pcVar5,0x106f1,"%s (errno: %d, %s)","PERFETTO_CHECK(address.size() == 1)"
                 ,(ulong)uVar1,pcVar7);
      goto LAB_0031c577;
    }
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&saddr,":",(allocator<char> *)&addr_info_1);
    SplitString(&port,parts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1,(string *)&saddr);
    ::std::__cxx11::string::~string((string *)&saddr);
    if ((long)port.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)port.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      pcVar5 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar6 = (uint *)__errno_location();
      uVar1 = *puVar6;
      pcVar7 = strerror(uVar1);
      LogMessage(kLogError,pcVar5,0x106f3,"%s (errno: %d, %s)","PERFETTO_CHECK(port.size() == 1)",
                 (ulong)uVar1,pcVar7);
      goto LAB_0031c577;
    }
    addr_info_1 = (addrinfo *)0x0;
    saddr.sun_path[6] = '\0';
    saddr.sun_path[7] = '\0';
    saddr.sun_path[8] = '\0';
    saddr.sun_path[9] = '\0';
    saddr.sun_path[10] = '\0';
    saddr.sun_path[0xb] = '\0';
    saddr.sun_path[0xc] = '\0';
    saddr.sun_path[0xd] = '\0';
    saddr.sun_path[0x1e] = '\0';
    saddr.sun_path[0x1f] = '\0';
    saddr.sun_path[0x20] = '\0';
    saddr.sun_path[0x21] = '\0';
    saddr.sun_path[0x22] = '\0';
    saddr.sun_path[0x23] = '\0';
    saddr.sun_path[0x24] = '\0';
    saddr.sun_path[0x25] = '\0';
    saddr.sun_path[0x26] = '\0';
    saddr.sun_path[0x27] = '\0';
    saddr.sun_path[0x28] = '\0';
    saddr.sun_path[0x29] = '\0';
    saddr.sun_path[0x2a] = '\0';
    saddr.sun_path[0x2b] = '\0';
    saddr.sun_path[0x2c] = '\0';
    saddr.sun_path[0x2d] = '\0';
    saddr.sun_path[0xe] = '\0';
    saddr.sun_path[0xf] = '\0';
    saddr.sun_path[0x10] = '\0';
    saddr.sun_path[0x11] = '\0';
    saddr.sun_path[0x12] = '\0';
    saddr.sun_path[0x13] = '\0';
    saddr.sun_path[0x14] = '\0';
    saddr.sun_path[0x15] = '\0';
    saddr.sun_path[0x16] = '\0';
    saddr.sun_path[0x17] = '\0';
    saddr.sun_path[0x18] = '\0';
    saddr.sun_path[0x19] = '\0';
    saddr.sun_path[0x1a] = '\0';
    saddr.sun_path[0x1b] = '\0';
    saddr.sun_path[0x1c] = '\0';
    saddr.sun_path[0x1d] = '\0';
    saddr.sun_family = 0;
    saddr.sun_path[0] = '\0';
    saddr.sun_path[1] = '\0';
    saddr.sun_path[2] = '\n';
    saddr.sun_path[3] = '\0';
    saddr.sun_path[4] = '\0';
    saddr.sun_path[5] = '\0';
    iVar3 = getaddrinfo(*(char **)addr_info,
                        ((port.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (addrinfo *)&saddr,(addrinfo **)&addr_info_1);
    if (iVar3 != 0) {
      pcVar5 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar6 = (uint *)__errno_location();
      uVar1 = *puVar6;
      pcVar7 = strerror(uVar1);
      LogMessage(kLogError,pcVar5,0x106f8,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(getaddrinfo(address[0].c_str(), port[0].c_str(), &hints, &addr_info) == 0)"
                 ,(ulong)uVar1,pcVar7);
      goto LAB_0031c577;
    }
    if (addr_info_1->ai_family != 10) {
      pcVar5 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar6 = (uint *)__errno_location();
      uVar1 = *puVar6;
      pcVar7 = strerror(uVar1);
      LogMessage(kLogError,pcVar5,0x106f9,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(addr_info->ai_family == AF_INET6)",(ulong)uVar1,pcVar7);
      goto LAB_0031c577;
    }
    SockaddrAny::SockaddrAny((SockaddrAny *)this,addr_info_1->ai_addr,addr_info_1->ai_addrlen);
    freeaddrinfo((addrinfo *)addr_info_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&port);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&addr_info);
  }
  else {
    if (family != kInet) {
      if (family != kUnix) {
        pcVar5 = Basename(
                         "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                         );
        puVar6 = (uint *)__errno_location();
        uVar1 = *puVar6;
        pcVar7 = strerror(uVar1);
        LogMessage(kLogError,pcVar5,0x10700,"%s (errno: %d, %s)","PERFETTO_CHECK(false)",
                   (ulong)uVar1,pcVar7);
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      saddr.sun_path[0x5e] = '\0';
      saddr.sun_path[0x5f] = '\0';
      saddr.sun_path[0x60] = '\0';
      saddr.sun_path[0x61] = '\0';
      saddr.sun_path[0x62] = '\0';
      saddr.sun_path[99] = '\0';
      saddr.sun_path[100] = '\0';
      saddr.sun_path[0x65] = '\0';
      saddr.sun_path[0x66] = '\0';
      saddr.sun_path[0x67] = '\0';
      saddr.sun_path[0x68] = '\0';
      saddr.sun_path[0x69] = '\0';
      saddr.sun_path[0x6a] = '\0';
      saddr.sun_path[0x6b] = '\0';
      saddr.sun_path[0x4e] = '\0';
      saddr.sun_path[0x4f] = '\0';
      saddr.sun_path[0x50] = '\0';
      saddr.sun_path[0x51] = '\0';
      saddr.sun_path[0x52] = '\0';
      saddr.sun_path[0x53] = '\0';
      saddr.sun_path[0x54] = '\0';
      saddr.sun_path[0x55] = '\0';
      saddr.sun_path[0x56] = '\0';
      saddr.sun_path[0x57] = '\0';
      saddr.sun_path[0x58] = '\0';
      saddr.sun_path[0x59] = '\0';
      saddr.sun_path[0x5a] = '\0';
      saddr.sun_path[0x5b] = '\0';
      saddr.sun_path[0x5c] = '\0';
      saddr.sun_path[0x5d] = '\0';
      saddr.sun_path[0x3e] = '\0';
      saddr.sun_path[0x3f] = '\0';
      saddr.sun_path[0x40] = '\0';
      saddr.sun_path[0x41] = '\0';
      saddr.sun_path[0x42] = '\0';
      saddr.sun_path[0x43] = '\0';
      saddr.sun_path[0x44] = '\0';
      saddr.sun_path[0x45] = '\0';
      saddr.sun_path[0x46] = '\0';
      saddr.sun_path[0x47] = '\0';
      saddr.sun_path[0x48] = '\0';
      saddr.sun_path[0x49] = '\0';
      saddr.sun_path[0x4a] = '\0';
      saddr.sun_path[0x4b] = '\0';
      saddr.sun_path[0x4c] = '\0';
      saddr.sun_path[0x4d] = '\0';
      saddr.sun_path[0x2e] = '\0';
      saddr.sun_path[0x2f] = '\0';
      saddr.sun_path[0x30] = '\0';
      saddr.sun_path[0x31] = '\0';
      saddr.sun_path[0x32] = '\0';
      saddr.sun_path[0x33] = '\0';
      saddr.sun_path[0x34] = '\0';
      saddr.sun_path[0x35] = '\0';
      saddr.sun_path[0x36] = '\0';
      saddr.sun_path[0x37] = '\0';
      saddr.sun_path[0x38] = '\0';
      saddr.sun_path[0x39] = '\0';
      saddr.sun_path[0x3a] = '\0';
      saddr.sun_path[0x3b] = '\0';
      saddr.sun_path[0x3c] = '\0';
      saddr.sun_path[0x3d] = '\0';
      saddr.sun_path[0x1e] = '\0';
      saddr.sun_path[0x1f] = '\0';
      saddr.sun_path[0x20] = '\0';
      saddr.sun_path[0x21] = '\0';
      saddr.sun_path[0x22] = '\0';
      saddr.sun_path[0x23] = '\0';
      saddr.sun_path[0x24] = '\0';
      saddr.sun_path[0x25] = '\0';
      saddr.sun_path[0x26] = '\0';
      saddr.sun_path[0x27] = '\0';
      saddr.sun_path[0x28] = '\0';
      saddr.sun_path[0x29] = '\0';
      saddr.sun_path[0x2a] = '\0';
      saddr.sun_path[0x2b] = '\0';
      saddr.sun_path[0x2c] = '\0';
      saddr.sun_path[0x2d] = '\0';
      saddr.sun_path[0xe] = '\0';
      saddr.sun_path[0xf] = '\0';
      saddr.sun_path[0x10] = '\0';
      saddr.sun_path[0x11] = '\0';
      saddr.sun_path[0x12] = '\0';
      saddr.sun_path[0x13] = '\0';
      saddr.sun_path[0x14] = '\0';
      saddr.sun_path[0x15] = '\0';
      saddr.sun_path[0x16] = '\0';
      saddr.sun_path[0x17] = '\0';
      saddr.sun_path[0x18] = '\0';
      saddr.sun_path[0x19] = '\0';
      saddr.sun_path[0x1a] = '\0';
      saddr.sun_path[0x1b] = '\0';
      saddr.sun_path[0x1c] = '\0';
      saddr.sun_path[0x1d] = '\0';
      saddr.sun_family = 0;
      saddr.sun_path[0] = '\0';
      saddr.sun_path[1] = '\0';
      saddr.sun_path[2] = '\0';
      saddr.sun_path[3] = '\0';
      saddr.sun_path[4] = '\0';
      saddr.sun_path[5] = '\0';
      saddr.sun_path[6] = '\0';
      saddr.sun_path[7] = '\0';
      saddr.sun_path[8] = '\0';
      saddr.sun_path[9] = '\0';
      saddr.sun_path[10] = '\0';
      saddr.sun_path[0xb] = '\0';
      saddr.sun_path[0xc] = '\0';
      saddr.sun_path[0xd] = '\0';
      __n = socket_name->_M_string_length;
      if (__n < 0x6c) {
        memcpy(saddr.sun_path,(socket_name->_M_dataplus)._M_p,__n);
        cVar8 = '\0';
        if (saddr.sun_path[0] != '@') {
          cVar8 = saddr.sun_path[0];
        }
        saddr.sun_path[0] = cVar8;
        saddr.sun_family = 1;
        SockaddrAny::SockaddrAny((SockaddrAny *)this,&saddr,(int)__n + 3);
        uVar9 = extraout_RDX_01;
      }
      else {
        piVar4 = __errno_location();
        *piVar4 = 0x24;
        *(undefined8 *)this = 0;
        *(undefined4 *)(this + 8) = 0;
        uVar9 = extraout_RDX;
      }
      goto LAB_0031c324;
    }
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&saddr,":",(allocator<char> *)&addr_info);
    SplitString(&parts,socket_name,(string *)&saddr);
    ::std::__cxx11::string::~string((string *)&saddr);
    if ((long)parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      pcVar5 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar6 = (uint *)__errno_location();
      uVar1 = *puVar6;
      pcVar7 = strerror(uVar1);
      LogMessage(kLogError,pcVar5,0x106e1,"%s (errno: %d, %s)","PERFETTO_CHECK(parts.size() == 2)",
                 (ulong)uVar1,pcVar7);
      goto LAB_0031c577;
    }
    addr_info = (addrinfo *)0x0;
    saddr.sun_path[6] = '\0';
    saddr.sun_path[7] = '\0';
    saddr.sun_path[8] = '\0';
    saddr.sun_path[9] = '\0';
    saddr.sun_path[10] = '\0';
    saddr.sun_path[0xb] = '\0';
    saddr.sun_path[0xc] = '\0';
    saddr.sun_path[0xd] = '\0';
    saddr.sun_path[0x1e] = '\0';
    saddr.sun_path[0x1f] = '\0';
    saddr.sun_path[0x20] = '\0';
    saddr.sun_path[0x21] = '\0';
    saddr.sun_path[0x22] = '\0';
    saddr.sun_path[0x23] = '\0';
    saddr.sun_path[0x24] = '\0';
    saddr.sun_path[0x25] = '\0';
    saddr.sun_path[0x26] = '\0';
    saddr.sun_path[0x27] = '\0';
    saddr.sun_path[0x28] = '\0';
    saddr.sun_path[0x29] = '\0';
    saddr.sun_path[0x2a] = '\0';
    saddr.sun_path[0x2b] = '\0';
    saddr.sun_path[0x2c] = '\0';
    saddr.sun_path[0x2d] = '\0';
    saddr.sun_path[0xe] = '\0';
    saddr.sun_path[0xf] = '\0';
    saddr.sun_path[0x10] = '\0';
    saddr.sun_path[0x11] = '\0';
    saddr.sun_path[0x12] = '\0';
    saddr.sun_path[0x13] = '\0';
    saddr.sun_path[0x14] = '\0';
    saddr.sun_path[0x15] = '\0';
    saddr.sun_path[0x16] = '\0';
    saddr.sun_path[0x17] = '\0';
    saddr.sun_path[0x18] = '\0';
    saddr.sun_path[0x19] = '\0';
    saddr.sun_path[0x1a] = '\0';
    saddr.sun_path[0x1b] = '\0';
    saddr.sun_path[0x1c] = '\0';
    saddr.sun_path[0x1d] = '\0';
    saddr.sun_family = 0;
    saddr.sun_path[0] = '\0';
    saddr.sun_path[1] = '\0';
    saddr.sun_path[2] = '\x02';
    saddr.sun_path[3] = '\0';
    saddr.sun_path[4] = '\0';
    saddr.sun_path[5] = '\0';
    iVar3 = getaddrinfo(((parts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        parts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                        (addrinfo *)&saddr,(addrinfo **)&addr_info);
    if (iVar3 != 0) {
      pcVar5 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar6 = (uint *)__errno_location();
      uVar1 = *puVar6;
      pcVar7 = strerror(uVar1);
      LogMessage(kLogError,pcVar5,0x106e6,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(getaddrinfo(parts[0].c_str(), parts[1].c_str(), &hints, &addr_info) == 0)"
                 ,(ulong)uVar1,pcVar7);
      goto LAB_0031c577;
    }
    if (addr_info->ai_family != 2) {
      pcVar5 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar6 = (uint *)__errno_location();
      uVar1 = *puVar6;
      pcVar7 = strerror(uVar1);
      LogMessage(kLogError,pcVar5,0x106e7,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(addr_info->ai_family == AF_INET)",(ulong)uVar1,pcVar7);
      goto LAB_0031c577;
    }
    SockaddrAny::SockaddrAny((SockaddrAny *)this,addr_info->ai_addr,addr_info->ai_addrlen);
    freeaddrinfo((addrinfo *)addr_info);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parts);
  uVar9 = extraout_RDX_00;
LAB_0031c324:
  SVar10._8_8_ = uVar9;
  SVar10.data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)this;
  return SVar10;
}

Assistant:

SockaddrAny MakeSockAddr(SockFamily family, const std::string& socket_name) {
  switch (family) {
    case SockFamily::kUnix: {
      struct sockaddr_un saddr {};
      const size_t name_len = socket_name.size();
      if (name_len >= sizeof(saddr.sun_path)) {
        errno = ENAMETOOLONG;
        return SockaddrAny();
      }
      memcpy(saddr.sun_path, socket_name.data(), name_len);
      if (saddr.sun_path[0] == '@') {
        saddr.sun_path[0] = '\0';
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
        // The MSDN blog claims that abstract (non-filesystem based) AF_UNIX
        // socket are supported, but that doesn't seem true.
        PERFETTO_ELOG(
            "Abstract AF_UNIX sockets are not supported on Windows, see "
            "https://github.com/microsoft/WSL/issues/4240");
        return SockaddrAny{};
#endif
      }
      saddr.sun_family = AF_UNIX;
      auto size = static_cast<socklen_t>(
          __builtin_offsetof(sockaddr_un, sun_path) + name_len + 1);
      PERFETTO_CHECK(static_cast<size_t>(size) <= sizeof(saddr));
      return SockaddrAny(&saddr, size);
    }
    case SockFamily::kInet: {
      auto parts = SplitString(socket_name, ":");
      PERFETTO_CHECK(parts.size() == 2);
      struct addrinfo* addr_info = nullptr;
      struct addrinfo hints {};
      hints.ai_family = AF_INET;
      PERFETTO_CHECK(getaddrinfo(parts[0].c_str(), parts[1].c_str(), &hints,
                                 &addr_info) == 0);
      PERFETTO_CHECK(addr_info->ai_family == AF_INET);
      SockaddrAny res(addr_info->ai_addr,
                      static_cast<socklen_t>(addr_info->ai_addrlen));
      freeaddrinfo(addr_info);
      return res;
    }
    case SockFamily::kInet6: {
      auto parts = SplitString(socket_name, "]");
      PERFETTO_CHECK(parts.size() == 2);
      auto address = SplitString(parts[0], "[");
      PERFETTO_CHECK(address.size() == 1);
      auto port = SplitString(parts[1], ":");
      PERFETTO_CHECK(port.size() == 1);
      struct addrinfo* addr_info = nullptr;
      struct addrinfo hints {};
      hints.ai_family = AF_INET6;
      PERFETTO_CHECK(getaddrinfo(address[0].c_str(), port[0].c_str(), &hints,
                                 &addr_info) == 0);
      PERFETTO_CHECK(addr_info->ai_family == AF_INET6);
      SockaddrAny res(addr_info->ai_addr,
                      static_cast<socklen_t>(addr_info->ai_addrlen));
      freeaddrinfo(addr_info);
      return res;
    }
  }
  PERFETTO_CHECK(false);  // For GCC.
}